

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O2

void AppendToIntegers(DuckDB *db,atomic<bool> *success)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  Connection con;
  allocator local_81;
  long *local_80;
  atomic<bool> *local_78;
  Connection local_70 [32];
  string local_50 [32];
  
  local_78 = success;
  duckdb::Connection::Connection(local_70,db);
  lVar2 = 2000;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    std::__cxx11::string::string(local_50,"INSERT INTO integers VALUES (1)",&local_81);
    duckdb::Connection::Query((string *)&local_80);
    std::__cxx11::string::~string(local_50);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_80);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (cVar1 != '\0') {
      LOCK();
      (local_78->_M_base)._M_i = false;
      UNLOCK();
    }
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
  }
  duckdb::Connection::~Connection(local_70);
  return;
}

Assistant:

static void AppendToIntegers(DuckDB *db, atomic<bool> *success) {
	Connection con(*db);
	for (idx_t i = 0; i < CONCURRENT_INDEX_INSERT_COUNT; i++) {
		auto result = con.Query("INSERT INTO integers VALUES (1)");
		if (result->HasError()) {
			*success = false;
		}
	}
}